

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mipsdsp_append(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,uint32_t op1,int rt,
                       int rs,int sa)

{
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  TCGv_i64 t;
  TCGv_i64 arg1;
  TCGv_i64 ret;
  
  tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  check_dsp_r2((DisasContext_conflict6 *)env);
  if (op1 == 0) {
    return;
  }
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rt);
  if ((int)ctx != 0x7c000035) {
    if ((int)ctx != 0x7c000031) goto LAB_0088fac3;
    uVar1 = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
    if (uVar1 == 0x7c000431) {
      if ((rs & 1U) != 0) {
        tcg_gen_shli_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],(ulong)((rs & 3U) * 8));
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
        tcg_gen_shri_i64_mips64el(tcg_ctx,t,t,(ulong)((rs & 3U) * -8 + 0x20));
LAB_0088fa9a:
        tcg_gen_or_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],t);
      }
    }
    else if (uVar1 == 0x7c000071) {
      if (rs != 0) {
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1]);
        tcg_gen_shri_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],(ulong)(uint)rs);
        tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,(ulong)(0x20 - rs));
        goto LAB_0088fa9a;
      }
    }
    else {
      if (uVar1 != 0x7c000031) goto LAB_0088f8f4;
      if (rs != 0) {
        tcg_gen_deposit_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[op1],t,tcg_ctx->cpu_gpr[op1],rs,0x20 - rs);
      }
    }
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1]);
    goto LAB_0088fac3;
  }
  uVar1 = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
  if (uVar1 == 0x7c000435) {
    uVar1 = rs & 7;
    if (uVar1 == 4 || (rs & 5U) == 0) goto LAB_0088fac3;
    tcg_gen_shli_i64_mips64el
              (tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],(ulong)(uVar1 * 8));
    tcg_gen_shri_i64_mips64el(tcg_ctx,t,t,(ulong)(uVar1 * -8 + 0x40));
LAB_0088fa3d:
    arg1 = tcg_ctx->cpu_gpr[op1];
    ret = arg1;
  }
  else {
    if (uVar1 == 0x7c000075) {
      if (rs == 0) goto LAB_0088fac3;
      tcg_gen_shri_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],(ulong)(uint)rs)
      ;
      tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,(ulong)(0x40 - rs));
      goto LAB_0088fa3d;
    }
    if (uVar1 != 0x7c0000f5) {
      if (uVar1 == 0x7c000035) {
        if (rs != 0) {
          tcg_gen_deposit_i64_mips64el
                    (tcg_ctx,tcg_ctx->cpu_gpr[op1],t,tcg_ctx->cpu_gpr[op1],rs,0x40 - rs);
        }
        goto LAB_0088fac3;
      }
LAB_0088f8f4:
      generate_exception_end((DisasContext_conflict6 *)env,0x14);
      goto LAB_0088fac3;
    }
    tcg_gen_shri_i64_mips64el
              (tcg_ctx,tcg_ctx->cpu_gpr[op1],tcg_ctx->cpu_gpr[op1],(ulong)(rs | 0x20U));
    tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,(ulong)(0x40 - (rs | 0x20U)));
    arg1 = t;
    ret = tcg_ctx->cpu_gpr[op1];
  }
  tcg_gen_or_i64_mips64el(tcg_ctx,ret,arg1,t);
LAB_0088fac3:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mipsdsp_append(CPUMIPSState *env, DisasContext *ctx,
                               uint32_t op1, int rt, int rs, int sa)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    check_dsp_r2(ctx);

    if (rt == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (op1) {
    case OPC_APPEND_DSP:
        switch (MASK_APPEND(ctx->opcode)) {
        case OPC_APPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 32 - sa);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_PREPEND:
            if (sa != 0) {
                tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 32 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_BALIGN:
            sa &= 3;
            if (sa != 0 && sa != 2) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (4 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK APPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DAPPEND_DSP:
        switch (MASK_DAPPEND(ctx->opcode)) {
        case OPC_DAPPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 64 - sa);
            }
            break;
        case OPC_PREPENDD:
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 0x20 | sa);
            tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - (0x20 | sa));
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, t0);
            break;
        case OPC_PREPENDW:
            if (sa != 0) {
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        case OPC_DBALIGN:
            sa &= 7;
            if (sa != 0 && sa != 2 && sa != 4) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (8 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK DAPPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}